

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O1

bool tinyusdz::detail::ParseMaterialXValue<int>(string *str,int *value,string *err)

{
  bool bVar1;
  int val;
  StreamReader sr;
  AsciiParser parser;
  int local_50c;
  StreamReader local_508;
  AsciiParser local_4e8;
  
  local_508.binary_ = (uint8_t *)(str->_M_dataplus)._M_p;
  local_508.length_ = str->_M_string_length;
  local_508.swap_endian_ = false;
  local_508.idx_ = 0;
  ascii::AsciiParser::AsciiParser(&local_4e8,&local_508);
  local_50c = 0;
  bVar1 = ParseValue<int>(&local_4e8,&local_50c,err);
  if (bVar1) {
    *value = local_50c;
  }
  ascii::AsciiParser::~AsciiParser(&local_4e8);
  return bVar1;
}

Assistant:

bool ParseMaterialXValue(const std::string &str, T *value, std::string *err) {
  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  T val{};

  if (!ParseValue(parser, val, err)) {
    return false;
  }

  (*value) = val;
  return true;
}